

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.hpp
# Opt level: O2

void czh::utils::grisu2(double v,string *buffer,int *K)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  double dVar4;
  DiyFp DVar5;
  DiyFp DVar6;
  DiyFp DVar7;
  DiyFp Mp;
  DiyFp local_90;
  DiyFp local_80;
  DiyFp local_70;
  DiyFp local_60;
  DiyFp local_50;
  DiyFp local_40;
  
  uVar1 = (uint)((ulong)v >> 0x34) & 0x7ff;
  uVar2 = ((ulong)v & 0xfffffffffffff) + 0x10000000000000;
  if (uVar1 == 0) {
    uVar2 = (ulong)v & 0xfffffffffffff;
  }
  iVar3 = -0x432;
  if (uVar1 != 0) {
    iVar3 = uVar1 - 0x433;
  }
  local_80.f = uVar2;
  local_80.e = iVar3;
  DiyFp::normalized_boundaries((tuple<czh::utils::DiyFp,_czh::utils::DiyFp> *)&local_70,&local_80);
  local_90.f = uVar2;
  local_90.e = iVar3;
  DVar5 = DiyFp::normalize(&local_90);
  local_80.f = DVar5.f;
  local_80.e = DVar5.e;
  dVar4 = ceil((double)(-0x3c - local_70.e) * 0.30102999566398114);
  DVar5 = cached_power((int)dVar4);
  local_90.f = DVar5.f;
  local_90.e = DVar5.e;
  DVar5 = DiyFp::operator*(&local_80,&local_90);
  DVar6 = DiyFp::operator*(&local_70,&local_90);
  local_40.e = DVar6.e;
  DVar7 = DiyFp::operator*(&local_60,&local_90);
  local_50.e = DVar7.e;
  local_50.f = DVar7.f + 1;
  local_40.f = DVar6.f - 1;
  DVar6 = DiyFp::operator-(&local_40,&local_50);
  *K = -(int)dVar4;
  Mp.e = local_40.e;
  Mp.f = local_40.f;
  DVar7._12_4_ = 0;
  DVar7.f = SUB128(DVar5._0_12_,0);
  DVar7.e = SUB124(DVar5._0_12_,8);
  Mp._12_4_ = 0;
  DVar5._8_8_ = K;
  DVar5.f = DVar6.f;
  digit_gen(DVar7,Mp,DVar5,buffer,K);
  return;
}

Assistant:

void grisu2(double v, std::string &buffer, int &K)
  {
    int q = 64, alpha = -59;
    auto[w_m, w_p] = DiyFp(v).normalized_boundaries();
    DiyFp w = DiyFp(v).normalize();
    int mk = k_comp(w_p.e + q, alpha);
    DiyFp c_mk = cached_power(mk);
    DiyFp W = w * c_mk;
    DiyFp Wp = w_p * c_mk;
    DiyFp Wm = w_m * c_mk;
    Wm.f++;
    Wp.f--;
    DiyFp delta = Wp - Wm;
    K = -mk;
    digit_gen(W, Wp, delta, buffer, K);
  }